

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall
cmCTestMultiProcessHandler::CreateSerialTestCostList(cmCTestMultiProcessHandler *this)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  iterator iVar3;
  pointer piVar4;
  _Base_ptr p_Var5;
  long lVar6;
  int *__buffer;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  pointer piVar10;
  pair<int_*,_long> pVar11;
  int testDependency;
  int test;
  TestList presortedList;
  TestList dependencies;
  TestSet alreadySortedTests;
  int local_b0;
  int local_ac;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  iterator iStack_a0;
  int *local_98;
  TestList local_88;
  vector<int,std::allocator<int>> *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_a8._M_current = (int *)0x0;
  iStack_a0._M_current = (int *)0x0;
  local_98 = (int *)0x0;
  p_Var5 = (this->Tests).
           super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Tests).
            super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      if (iStack_a0._M_current == local_98) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,(int *)(p_Var5 + 1));
      }
      else {
        *iStack_a0._M_current = p_Var5[1]._M_color;
        iStack_a0._M_current = iStack_a0._M_current + 1;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  iVar3._M_current = iStack_a0._M_current;
  _Var9._M_current = local_a8._M_current;
  if (local_a8._M_current != iStack_a0._M_current) {
    lVar6 = (long)iStack_a0._M_current - (long)local_a8._M_current >> 2;
    pVar11 = std::get_temporary_buffer<int>((lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
    lVar6 = pVar11.second;
    __buffer = pVar11.first;
    if (__buffer == (int *)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
                (_Var9,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       iVar3._M_current,(_Iter_comp_iter<TestComparator>)this);
      lVar6 = 0;
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
                (_Var9,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       iVar3._M_current,__buffer,lVar6,(_Iter_comp_iter<TestComparator>)this);
    }
    operator_delete(__buffer,lVar6 << 2);
  }
  iVar3._M_current = iStack_a0._M_current;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (local_a8._M_current != iStack_a0._M_current) {
    local_68 = (vector<int,std::allocator<int>> *)&this->SortedTests;
    _Var9._M_current = local_a8._M_current;
    do {
      local_ac = *_Var9._M_current;
      p_Var7 = &p_Var1->_M_header;
      for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
          p_Var5 = (&p_Var5->_M_left)[(int)*(size_t *)(p_Var5 + 1) < local_ac]) {
        if (local_ac <= (int)*(size_t *)(p_Var5 + 1)) {
          p_Var7 = p_Var5;
        }
      }
      p_Var8 = p_Var1;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (p_Var8 = (_Rb_tree_header *)p_Var7,
         local_ac < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
        p_Var8 = p_Var1;
      }
      if (p_Var8 == p_Var1) {
        local_88.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (int *)0x0;
        local_88.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (int *)0x0;
        local_88.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        GetAllTestDependencies(this,local_ac,&local_88);
        piVar4 = local_88.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        for (piVar10 = local_88.super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start; piVar10 != piVar4; piVar10 = piVar10 + 1) {
          local_b0 = *piVar10;
          p_Var7 = &p_Var1->_M_header;
          for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var5 != (_Base_ptr)0x0;
              p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < local_b0]) {
            if (local_b0 <= (int)p_Var5[1]._M_color) {
              p_Var7 = p_Var5;
            }
          }
          p_Var5 = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
             (p_Var5 = p_Var7, local_b0 < (int)p_Var7[1]._M_color)) {
            p_Var5 = &p_Var1->_M_header;
          }
          if ((_Rb_tree_header *)p_Var5 == p_Var1) {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_60,&local_b0);
            iVar2._M_current =
                 (this->SortedTests).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
            if (iVar2._M_current ==
                (this->SortedTests).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_68,iVar2,&local_b0);
            }
            else {
              *iVar2._M_current = local_b0;
              (this->SortedTests).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = iVar2._M_current + 1;
            }
          }
        }
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,&local_ac);
        iVar2._M_current =
             (this->SortedTests).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        if (iVar2._M_current ==
            (this->SortedTests).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_68,iVar2,&local_ac);
        }
        else {
          *iVar2._M_current = local_ac;
          (this->SortedTests).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               iVar2._M_current + 1;
        }
        if (local_88.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            != (int *)0x0) {
          operator_delete(local_88.super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88.super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      _Var9._M_current = _Var9._M_current + 1;
    } while (_Var9._M_current != iVar3._M_current);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  if (local_a8._M_current != (int *)0x0) {
    operator_delete(local_a8._M_current,(long)local_98 - (long)local_a8._M_current);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CreateSerialTestCostList()
{
  TestList presortedList;

  for (auto const& i : this->Tests) {
    presortedList.push_back(i.first);
  }

  std::stable_sort(presortedList.begin(), presortedList.end(),
                   TestComparator(this));

  TestSet alreadySortedTests;

  for (int test : presortedList) {
    if (alreadySortedTests.find(test) != alreadySortedTests.end()) {
      continue;
    }

    TestList dependencies;
    GetAllTestDependencies(test, dependencies);

    for (int testDependency : dependencies) {
      if (alreadySortedTests.find(testDependency) ==
          alreadySortedTests.end()) {
        alreadySortedTests.insert(testDependency);
        this->SortedTests.push_back(testDependency);
      }
    }

    alreadySortedTests.insert(test);
    this->SortedTests.push_back(test);
  }
}